

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

void icetGetIntegerv(IceTEnum pname,IceTInt *params)

{
  void *pvVar1;
  ulong uVar2;
  IceTState pIVar3;
  long lVar4;
  IceTEnum type;
  char msg [256];
  char acStack_118 [264];
  
  uVar2 = (ulong)pname;
  pIVar3 = icetGetState();
  switch(pIVar3[uVar2].type) {
  case 0x8000:
    if (0 < pIVar3[uVar2].num_entries) {
      pvVar1 = pIVar3[uVar2].data;
      lVar4 = 0;
      do {
        params[lVar4] = (uint)*(byte *)((long)pvVar1 + lVar4);
        lVar4 = lVar4 + 1;
      } while (lVar4 < pIVar3[uVar2].num_entries);
    }
    break;
  case 0x8001:
  case 0x8002:
switchD_0010a6a1_caseD_8001:
    sprintf(acStack_118,"Could not cast value for 0x%x.",uVar2);
    type = 0xfffffffd;
    goto LAB_0010a71b;
  case 0x8003:
    if (0 < pIVar3[uVar2].num_entries) {
      pvVar1 = pIVar3[uVar2].data;
      lVar4 = 0;
      do {
        params[lVar4] = *(IceTInt *)((long)pvVar1 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 < pIVar3[uVar2].num_entries);
    }
    break;
  case 0x8004:
    if (0 < pIVar3[uVar2].num_entries) {
      pvVar1 = pIVar3[uVar2].data;
      lVar4 = 0;
      do {
        params[lVar4] = (int)*(float *)((long)pvVar1 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 < pIVar3[uVar2].num_entries);
    }
    break;
  case 0x8005:
    if (0 < pIVar3[uVar2].num_entries) {
      pvVar1 = pIVar3[uVar2].data;
      lVar4 = 0;
      do {
        params[lVar4] = (int)*(double *)((long)pvVar1 + lVar4 * 8);
        lVar4 = lVar4 + 1;
      } while (lVar4 < pIVar3[uVar2].num_entries);
    }
    break;
  default:
    if (pIVar3[uVar2].type != 0) goto switchD_0010a6a1_caseD_8001;
    sprintf(acStack_118,"No such parameter, 0x%x.",uVar2);
    type = 0xfffffffe;
LAB_0010a71b:
    icetRaiseDiagnostic(acStack_118,type,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x15e);
  }
  return;
}

Assistant:

void icetGetIntegerv(IceTEnum pname, IceTInt *params)
{
    struct IceTStateValue *value = icetGetState() + pname;
    int i;
    stateCheck(pname, icetGetState());
    copyArray(IceTInt, params, value->type, value->data, value->num_entries);
}